

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Maze.cpp
# Opt level: O2

void __thiscall Maze::pathBetweenCells(Maze *this)

{
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *this_00;
  _Tuple_impl<0UL,_int,_int> _Var1;
  tuple<int,_int> *ptVar2;
  _Tuple_impl<0UL,_int,_int> in_RAX;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  _Elt_pointer ptVar6;
  _Elt_pointer ptVar7;
  ostream *poVar8;
  _Elt_pointer ptVar9;
  size_type sVar10;
  size_type sVar11;
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  reference rVar15;
  tuple<int,_int> successorIndex;
  undefined1 local_38 [8];
  
  local_38 = (undefined1  [8])in_RAX;
  startCellEndCells(this);
  sVar11 = (size_type)
           (this->startCell).super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>.
           _M_head_impl;
  sVar10 = (size_type)
           (this->startCell).super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
           super__Head_base<1UL,_int,_false>._M_head_impl;
  pvVar3 = std::
           vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           ::at(&this->used,sVar11);
  rVar15 = std::vector<bool,_std::allocator<bool>_>::at(pvVar3,sVar10);
  *rVar15._M_p = *rVar15._M_p | rVar15._M_mask;
  this_00 = &this->solvedMatrix;
  pvVar4 = std::
           vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           ::at(this_00,sVar11);
  pvVar5 = std::vector<char,_std::allocator<char>_>::at(pvVar4,sVar10);
  *pvVar5 = ' ';
  std::deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::push_back
            ((deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)this,
             &this->startCell);
  ptVar7 = (this->pathStack).c.
           super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  ptVar6 = (this->pathStack).c.
           super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  while( true ) {
    if (ptVar6 == ptVar7) {
      return;
    }
    if (ptVar6 == (this->pathStack).c.
                  super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ptVar6 = (this->pathStack).c.
               super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x3f;
    }
    else {
      ptVar6 = ptVar6 + -1;
    }
    adjacentCells((Maze *)local_38,(int)this,
                  (ptVar6->super__Tuple_impl<0UL,_int,_int>).super__Head_base<0UL,_int,_false>.
                  _M_head_impl);
    ptVar7 = (this->pathStack).c.
             super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl
             .super__Deque_impl_data._M_finish._M_cur;
    if (ptVar7 == (this->pathStack).c.
                  super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ptVar2 = (this->pathStack).c.
               super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1];
      ptVar6 = ptVar2 + 0x3f;
      ptVar7 = ptVar2 + 0x40;
    }
    else {
      ptVar6 = ptVar7 + -1;
    }
    sVar10 = (size_type)(int)local_38._4_4_;
    if (local_38._4_4_ == -1) {
      iVar13 = ptVar7[-1].super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
               super__Head_base<1UL,_int,_false>._M_head_impl;
      pvVar4 = std::
               vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ::at(this_00,(long)(ptVar6->super__Tuple_impl<0UL,_int,_int>).
                                  super__Head_base<0UL,_int,_false>._M_head_impl);
      pvVar5 = std::vector<char,_std::allocator<char>_>::at(pvVar4,(long)iVar13);
      *pvVar5 = '0';
      std::deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::pop_back
                ((deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)this);
    }
    else {
      sVar11 = (size_type)(int)local_38._0_4_;
      std::deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::push_back
                ((deque<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)this,
                 (value_type *)local_38);
      pvVar4 = std::
               vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
               ::at(this_00,sVar10);
      pvVar5 = std::vector<char,_std::allocator<char>_>::at(pvVar4,sVar11);
      *pvVar5 = ' ';
      pvVar3 = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::at(&this->used,sVar10);
      rVar15 = std::vector<bool,_std::allocator<bool>_>::at(pvVar3,sVar11);
      *rVar15._M_p = *rVar15._M_p | rVar15._M_mask;
    }
    ptVar7 = (this->pathStack).c.
             super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl
             .super__Deque_impl_data._M_start._M_cur;
    ptVar6 = (this->pathStack).c.
             super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl
             .super__Deque_impl_data._M_finish._M_cur;
    if (ptVar6 == ptVar7) break;
    ptVar9 = ptVar6;
    if (ptVar6 == (this->pathStack).c.
                  super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ptVar9 = (this->pathStack).c.
               super__Deque_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    _Var1 = (this->endCell).super__Tuple_impl<0UL,_int,_int>;
    iVar13 = -(uint)((_Head_base<1UL,_int,_false>)
                     _Var1.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>.
                     _M_head_impl ==
                    ptVar9[-1].super__Tuple_impl<0UL,_int,_int>.super__Tuple_impl<1UL,_int>.
                    super__Head_base<1UL,_int,_false>);
    iVar14 = -(uint)(_Var1.super__Head_base<0UL,_int,_false>._M_head_impl._M_head_impl ==
                    ptVar9[-1].super__Tuple_impl<0UL,_int,_int>.super__Head_base<0UL,_int,_false>.
                    _M_head_impl);
    auVar12._4_4_ = iVar13;
    auVar12._0_4_ = iVar13;
    auVar12._8_4_ = iVar14;
    auVar12._12_4_ = iVar14;
    iVar13 = movmskpd((int)ptVar9,auVar12);
    if (iVar13 == 3) {
      this->isSolved = true;
      printSolved(this);
      return;
    }
  }
  poVar8 = std::operator<<((ostream *)&std::cout,"Error: their is no path");
  std::endl<char,std::char_traits<char>>(poVar8);
  return;
}

Assistant:

void Maze::pathBetweenCells() {
    //generates a path between the cells, and shows the path with spaces in the solvedMatrix.
    startCellEndCells();
    int row = std::get<0>(startCell);
    int column = std::get<1>(startCell);
    used.at(row).at(column) = true;
    //MARK START AS SOLVED
    solvedMatrix.at(row).at(column) = ' ';
    pathStack.push(startCell);
    while(!pathStack.empty()){
        auto successorIndex = adjacentCells(std::get<0>(pathStack.top()),std::get<1>(pathStack.top()));
        row = std::get<0>(successorIndex);
        column =std::get<1>(successorIndex);

        int topOfStackRow = std::get<0>(pathStack.top());
        int topOfStackColumn = std::get<1>(pathStack.top());

        if(std::get<0>(successorIndex) == -1){
            //UNMARK CURRENT CELL, as unsolved.
            //BACK TRACK
            solvedMatrix.at(topOfStackRow).at(topOfStackColumn) = '0';
            pathStack.pop();
        }
        else{
            pathStack.push(successorIndex);
            solvedMatrix.at(row).at(column) = ' ';
            used.at(row).at(column) = true;
        }
        if(pathStack.empty()){
            std::cout<<"Error: their is no path"
            <<std::endl;
            break;
        }
        if(pathStack.top() == endCell){
            isSolved = true;
            printSolved();
            break;
        }
    }
}